

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer.cc
# Opt level: O1

Status __thiscall
sentencepiece::normalizer::Normalizer::Normalize
          (Normalizer *this,string_view input,string *normalized,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *norm_to_orig)

{
  pointer puVar1;
  iterator iVar2;
  pointer puVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  undefined1 auVar7 [8];
  uint uVar8;
  char *pcVar9;
  Normalizer *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R9;
  int iVar10;
  size_t n;
  long lVar11;
  uint uVar12;
  unsigned_long uVar13;
  unsigned_long uVar14;
  byte bVar15;
  bool bVar16;
  string_view input_00;
  string_view input_01;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> p;
  unsigned_long local_1c0;
  Normalizer *local_1b8;
  undefined1 local_1b0 [8];
  char *local_1a8;
  int local_1a0;
  ios_base local_138 [264];
  
  pcVar6 = input._M_str;
  this_00 = (Normalizer *)input._M_len;
  puVar1 = (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  (norm_to_orig->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)
   (norm_to_orig->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start = 0;
  if (pcVar6 != (char *)0x0) {
    (*this_00->_vptr_Normalizer[3])(this,this_00);
    if (this->_vptr_Normalizer != (_func_int **)0x0) {
      return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
              )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                )this;
    }
    util::Status::~Status((Status *)this);
    if (this_00->spec_->remove_extra_whitespaces_ == true) {
      iVar10 = 0;
      do {
        if (pcVar6 == (char *)0x0) break;
        input_00._M_str = (char *)normalized;
        input_00._M_len = (size_t)pcVar6;
        NormalizePrefix((pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> *)
                        local_1b0,this_00,input_00);
        if ((local_1b0 == (undefined1  [8])0x1) && (iVar4 = bcmp(local_1a8," ",1), iVar4 == 0)) {
          normalized = (string *)((long)&(normalized->_M_dataplus)._M_p + (long)local_1a0);
          pcVar6 = pcVar6 + -(long)local_1a0;
          iVar10 = iVar10 + local_1a0;
          bVar16 = true;
        }
        else {
          bVar16 = false;
        }
      } while (bVar16);
    }
    else {
      iVar10 = 0;
    }
    if (pcVar6 != (char *)0x0) {
      std::__cxx11::string::reserve((ulong)norm_to_orig);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(in_R9,(long)pcVar6 * 3);
      if ((this_00->treat_whitespace_as_suffix_ == false) &&
         (this_00->spec_->add_dummy_prefix_ == true)) {
        uVar13 = (unsigned_long)iVar10;
        local_1b0 = (undefined1  [8])uVar13;
        if (this_00->spec_->escape_whitespaces_ == true) {
          lVar11 = 3;
          std::__cxx11::string::append((char *)norm_to_orig,0x2527a4);
          do {
            iVar2._M_current =
                 (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              local_1b0 = (undefined1  [8])uVar13;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>(in_R9,iVar2,(unsigned_long *)local_1b0);
            }
            else {
              *iVar2._M_current = uVar13;
              (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
              local_1b0 = (undefined1  [8])uVar13;
            }
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        else {
          std::__cxx11::string::append((char *)norm_to_orig);
          iVar2._M_current =
               (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(in_R9,iVar2,(unsigned_long *)local_1b0);
          }
          else {
            *iVar2._M_current = uVar13;
            (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
        }
      }
      bVar15 = this_00->spec_->remove_extra_whitespaces_;
      local_1b8 = this_00;
      do {
        input_01._M_str = (char *)normalized;
        input_01._M_len = (size_t)pcVar6;
        NormalizePrefix((pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> *)
                        local_1b0,this_00,input_01);
        uVar13 = (long)local_1b0 + 1;
        pcVar5 = local_1a8 + -1;
        do {
          auVar7 = local_1b0;
          pcVar9 = local_1a8;
          if ((bVar15 & 1) == 0) break;
          if (uVar13 == 1) {
            bVar16 = false;
          }
          else {
            bVar16 = pcVar5[1] == ' ';
          }
          uVar13 = uVar13 - 1;
          pcVar5 = pcVar5 + 1;
          auVar7 = (undefined1  [8])uVar13;
          pcVar9 = pcVar5;
        } while (bVar16);
        if (auVar7 != (undefined1  [8])0x0) {
          uVar14 = (unsigned_long)iVar10;
          uVar13 = 0;
          do {
            if ((this_00->spec_->escape_whitespaces_ == true) && (pcVar9[uVar13] == ' ')) {
              lVar11 = 3;
              std::__cxx11::string::append((char *)norm_to_orig,0x2527a4);
              do {
                iVar2._M_current =
                     (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar2._M_current ==
                    (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  local_1c0 = uVar14;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<unsigned_long>(in_R9,iVar2,&local_1c0);
                }
                else {
                  *iVar2._M_current = uVar14;
                  (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                  local_1c0 = uVar14;
                }
                lVar11 = lVar11 + -1;
              } while (lVar11 != 0);
            }
            else {
              std::__cxx11::string::push_back((char)norm_to_orig);
              iVar2._M_current =
                   (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar2._M_current ==
                  (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_end_of_storage) {
                local_1c0 = uVar14;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                _M_realloc_insert<unsigned_long>(in_R9,iVar2,&local_1c0);
              }
              else {
                *iVar2._M_current = uVar14;
                (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                local_1c0 = uVar14;
              }
            }
            uVar13 = uVar13 + 1;
            this_00 = local_1b8;
          } while ((undefined1  [8])uVar13 != auVar7);
          bVar15 = pcVar9[(long)auVar7 - 1] == ' ';
        }
        iVar10 = iVar10 + local_1a0;
        normalized = (string *)((long)&(normalized->_M_dataplus)._M_p + (long)local_1a0);
        if (this_00->spec_->remove_extra_whitespaces_ == false) {
          bVar15 = 0;
        }
        pcVar6 = pcVar6 + -(long)local_1a0;
      } while (pcVar6 != (char *)0x0);
      if (this_00->spec_->remove_extra_whitespaces_ == true) {
        bVar16 = this_00->spec_->escape_whitespaces_;
        pcVar6 = " ";
        if (bVar16 != false) {
          pcVar6 = anon_var_dwarf_8a1af;
        }
        puVar1 = (pointer)((ulong)bVar16 * 2 + 1);
        do {
          puVar3 = (norm_to_orig->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar11 = (long)puVar3 - (long)puVar1;
          if (puVar3 < puVar1) {
            bVar16 = false;
          }
          else {
            iVar4 = bcmp((void *)((long)(norm_to_orig->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar11),pcVar6,
                         (size_t)puVar1);
            bVar16 = iVar4 == 0;
          }
          if (!bVar16) goto LAB_001f1122;
          uVar8 = (uint)lVar11;
          if ((int)uVar8 < 0) {
            local_1b0._0_4_ = 0xd;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"third_party/sentencepiece/src/normalizer.cc",0x2b);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"(",1);
            std::ostream::operator<<((ostringstream *)&local_1a8,0xab);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,") [",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"(length) >= (0)",0xf);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"] ",2);
            util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          else {
            uVar12 = uVar8 & 0x7fffffff;
            iVar10 = (int)(in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                          ._M_impl.super__Vector_impl_data._M_start[uVar12];
            std::__cxx11::string::resize((ulong)norm_to_orig,(char)uVar12);
            this_00 = local_1b8;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(in_R9,(ulong)uVar12);
          }
        } while (-1 < (int)uVar8);
        if (bVar16) {
          return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                  )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                    )this;
        }
      }
LAB_001f1122:
      uVar13 = (unsigned_long)iVar10;
      if ((this_00->treat_whitespace_as_suffix_ == true) &&
         (this_00->spec_->add_dummy_prefix_ == true)) {
        if (this_00->spec_->escape_whitespaces_ == true) {
          lVar11 = 3;
          std::__cxx11::string::append((char *)norm_to_orig,0x2527a4);
          do {
            iVar2._M_current =
                 (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              local_1b0 = (undefined1  [8])uVar13;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>(in_R9,iVar2,(unsigned_long *)local_1b0);
            }
            else {
              *iVar2._M_current = uVar13;
              (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        else {
          std::__cxx11::string::append((char *)norm_to_orig);
          iVar2._M_current =
               (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_1b0 = (undefined1  [8])uVar13;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(in_R9,iVar2,(unsigned_long *)local_1b0);
          }
          else {
            *iVar2._M_current = uVar13;
            (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
        }
      }
      iVar2._M_current =
           (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_1b0 = (undefined1  [8])uVar13;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (in_R9,iVar2,(unsigned_long *)local_1b0);
      }
      else {
        *iVar2._M_current = uVar13;
        (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        local_1b0 = (undefined1  [8])uVar13;
      }
      if ((long)(in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 !=
          (long)(norm_to_orig->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish + 1) {
        local_1b0._0_4_ = 0xd;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"third_party/sentencepiece/src/normalizer.cc",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"(",1);
        std::ostream::operator<<((ostringstream *)&local_1a8,0xb7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"(norm_to_orig->size()) == (normalized->size() + 1)",0x32);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"] ",2);
        util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                  )this;
      }
    }
  }
  util::Status::Status((Status *)this);
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status Normalizer::Normalize(absl::string_view input,
                                   std::string *normalized,
                                   std::vector<size_t> *norm_to_orig) const {
  norm_to_orig->clear();
  normalized->clear();

  if (input.empty()) {
    return util::OkStatus();
  }

  RETURN_IF_ERROR(status());

  int consumed = 0;

  // Ignores heading space.
  if (spec_->remove_extra_whitespaces()) {
    while (!input.empty()) {
      const auto p = NormalizePrefix(input);
      if (p.first != " ") {
        break;
      }
      input.remove_prefix(p.second);
      consumed += p.second;
    }
  }

  // all chars are whitespace.
  if (input.empty()) {
    return util::OkStatus();
  }

  // Reserves the output buffer to avoid re-allocations.
  const size_t kReservedSize = input.size() * 3;
  normalized->reserve(kReservedSize);
  norm_to_orig->reserve(kReservedSize);

  // Replaces white space with U+2581 (LOWER ONE EIGHT BLOCK)
  // if escape_whitespaces() is set (default = true).
  const absl::string_view kSpaceSymbol = "\xe2\x96\x81";

  // adds kSpaceSymbol to the current context.
  auto add_ws = [this, &consumed, &normalized, &norm_to_orig, &kSpaceSymbol]() {
    if (spec_->escape_whitespaces()) {
      normalized->append(kSpaceSymbol.data(), kSpaceSymbol.size());
      for (size_t n = 0; n < kSpaceSymbol.size(); ++n) {
        norm_to_orig->push_back(consumed);
      }
    } else {
      normalized->append(" ");
      norm_to_orig->push_back(consumed);
    }
  };

  // Adds a space symbol as a prefix (default is true)
  // With this prefix, "world" and "hello world" are converted into
  // "_world" and "_hello_world", which help the trainer to extract
  // "_world" as one symbol.
  if (!treat_whitespace_as_suffix_ && spec_->add_dummy_prefix()) add_ws();

  bool is_prev_space = spec_->remove_extra_whitespaces();
  while (!input.empty()) {
    auto p = NormalizePrefix(input);
    absl::string_view sp = p.first;

    // Removes heading spaces in sentence piece,
    // if the previous sentence piece ends with whitespace.
    while (is_prev_space && absl::ConsumePrefix(&sp, " ")) {
    }

    if (!sp.empty()) {
      const char *data = sp.data();
      for (size_t n = 0; n < sp.size(); ++n) {
        if (spec_->escape_whitespaces() && data[n] == ' ') {
          // replace ' ' with kSpaceSymbol.
          normalized->append(kSpaceSymbol.data(), kSpaceSymbol.size());
          for (size_t m = 0; m < kSpaceSymbol.size(); ++m) {
            norm_to_orig->push_back(consumed);
          }
        } else {
          *normalized += data[n];
          norm_to_orig->push_back(consumed);
        }
      }
      // Checks whether the last character of sp is whitespace.
      is_prev_space = absl::EndsWith(sp, " ");
    }

    consumed += p.second;
    input.remove_prefix(p.second);
    if (!spec_->remove_extra_whitespaces()) {
      is_prev_space = false;
    }
  }

  // Ignores trailing space.
  if (spec_->remove_extra_whitespaces()) {
    const absl::string_view space =
        spec_->escape_whitespaces() ? kSpaceSymbol : " ";
    while (absl::EndsWith(*normalized, space)) {
      const int length = normalized->size() - space.size();
      CHECK_GE_OR_RETURN(length, 0);
      consumed = (*norm_to_orig)[length];
      normalized->resize(length);
      norm_to_orig->resize(length);
    }
  }

  // Adds a space symbol as a suffix (default is false)
  if (treat_whitespace_as_suffix_ && spec_->add_dummy_prefix()) add_ws();

  norm_to_orig->push_back(consumed);

  CHECK_EQ_OR_RETURN(norm_to_orig->size(), normalized->size() + 1);

  return util::OkStatus();
}